

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

LanczosSincFilter *
pbrt::LanczosSincFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  LanczosSincFilter *pLVar1;
  ParameterDictionary *in_RDI;
  Float FVar2;
  Float x;
  Float tau;
  Float yw;
  Float xw;
  float in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  ParameterDictionary *in_stack_ffffffffffffff10;
  polymorphic_allocator<std::byte> *args_2;
  undefined4 in_stack_ffffffffffffff20;
  ParameterDictionary *args;
  polymorphic_allocator<std::byte> *this;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined8 local_a1;
  float local_80;
  undefined8 local_79;
  Float local_58;
  allocator<char> local_41;
  string local_40 [36];
  Float local_1c;
  ParameterDictionary *local_10;
  
  __s = &local_41;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)__s,(allocator<char> *)in_RDI);
  FVar2 = ParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff10,
                     (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0.0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  this = (polymorphic_allocator<std::byte> *)&local_79;
  args = local_10;
  local_1c = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)__s,(allocator<char> *)in_RDI);
  FVar2 = ParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff10,
                     (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0.0);
  std::__cxx11::string::~string((string *)((long)&local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  args_2 = (polymorphic_allocator<std::byte> *)&local_a1;
  local_58 = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)__s,(allocator<char> *)in_RDI);
  x = ParameterDictionary::GetOneFloat
                (local_10,(string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 0.0);
  std::__cxx11::string::~string((string *)((long)&local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = x;
  Vector2<float>::Vector2((Vector2<float> *)local_10,x,in_stack_ffffffffffffff08);
  pLVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::LanczosSincFilter,pbrt::Vector2<float>,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (this,(Vector2<float> *)args,(float *)CONCAT44(FVar2,in_stack_ffffffffffffff20)
                      ,args_2);
  return pLVar1;
}

Assistant:

LanczosSincFilter *LanczosSincFilter::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    Float xw = parameters.GetOneFloat("xradius", 4.);
    Float yw = parameters.GetOneFloat("yradius", 4.);
    Float tau = parameters.GetOneFloat("tau", 3.f);
    return alloc.new_object<LanczosSincFilter>(Vector2f(xw, yw), tau, alloc);
}